

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O3

void __thiscall tinyusdz::RelationshipProperty::RelationshipProperty(RelationshipProperty *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_authored = false;
  (this->_relationship).type = DefineOnly;
  (this->_relationship).targetPath._prim_part._M_dataplus._M_p =
       (pointer)&(this->_relationship).targetPath._prim_part.field_2;
  (this->_relationship).targetPath._prim_part._M_string_length = 0;
  (this->_relationship).targetPath._prim_part.field_2._M_local_buf[0] = '\0';
  (this->_relationship).targetPath._prop_part._M_dataplus._M_p =
       (pointer)&(this->_relationship).targetPath._prop_part.field_2;
  (this->_relationship).targetPath._prop_part._M_string_length = 0;
  (this->_relationship).targetPath._prop_part.field_2._M_local_buf[0] = '\0';
  (this->_relationship).targetPath._variant_part._M_dataplus._M_p =
       (pointer)&(this->_relationship).targetPath._variant_part.field_2;
  (this->_relationship).targetPath._variant_part._M_string_length = 0;
  (this->_relationship).targetPath._variant_part.field_2._M_local_buf[0] = '\0';
  (this->_relationship).targetPath._variant_selection_part._M_dataplus._M_p =
       (pointer)&(this->_relationship).targetPath._variant_selection_part.field_2;
  (this->_relationship).targetPath._variant_selection_part._M_string_length = 0;
  (this->_relationship).targetPath._variant_selection_part.field_2._M_local_buf[0] = '\0';
  (this->_relationship).targetPath._variant_part_str._M_dataplus._M_p =
       (pointer)&(this->_relationship).targetPath._variant_part_str.field_2;
  (this->_relationship).targetPath._variant_part_str._M_string_length = 0;
  (this->_relationship).targetPath._variant_part_str.field_2._M_local_buf[0] = '\0';
  (this->_relationship).targetPath._element._M_dataplus._M_p =
       (pointer)&(this->_relationship).targetPath._element.field_2;
  (this->_relationship).targetPath._element._M_string_length = 0;
  (this->_relationship).targetPath._element.field_2._M_local_buf[0] = '\0';
  (this->_relationship).targetPath._path_type.has_value_ = false;
  (this->_relationship).targetPath._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
  (this->_relationship).targetPath._valid = false;
  (this->_relationship)._metas.interpolation.has_value_ = false;
  (this->_relationship)._metas.interpolation.contained = (storage_t<tinyusdz::Interpolation>)0x0;
  (this->_relationship)._metas.elementSize.has_value_ = false;
  (this->_relationship)._metas.elementSize.contained = (storage_t<unsigned_int>)0x0;
  (this->_relationship)._metas.hidden.has_value_ = false;
  (this->_relationship)._metas.hidden.contained = (storage_t<bool>)0x0;
  (this->_relationship)._metas.comment.has_value_ = false;
  (this->_relationship)._metas.weight.contained = (storage_t<double>)0x0;
  (this->_relationship)._metas.connectability.has_value_ = false;
  *(undefined8 *)((long)&(this->_relationship)._metas.bindMaterialAs.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.bindMaterialAs.contained + 0x18) = 0;
  *(undefined8 *)&(this->_relationship)._metas.bindMaterialAs.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.bindMaterialAs.contained + 8) = 0;
  p_Var1 = &(this->_relationship)._metas.meta._M_t._M_impl.super__Rb_tree_header;
  (this->_relationship)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->_relationship)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 8) =
       (_Base_ptr)0x0;
  *(undefined8 *)&(this->_relationship)._metas.comment.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.comment.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.comment.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.comment.contained + 0x18) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.comment.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.comment.contained + 0x28) = 0;
  (this->_relationship)._metas.customData.has_value_ = false;
  (this->_relationship)._metas.weight.has_value_ = false;
  *(undefined8 *)((long)&(this->_relationship)._metas.customData.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.customData.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.customData.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.customData.contained + 0x18) = 0;
  *(undefined8 *)&(this->_relationship)._metas.customData.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.customData.contained + 8) = 0;
  (this->_relationship)._metas.outputName.has_value_ = false;
  *(undefined8 *)((long)&(this->_relationship)._metas.connectability.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.connectability.contained + 0x18) = 0;
  *(undefined8 *)&(this->_relationship)._metas.connectability.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.connectability.contained + 8) = 0;
  *(undefined8 *)&(this->_relationship)._metas.outputName.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.outputName.contained + 8) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.outputName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.outputName.contained + 0x18) = 0;
  (this->_relationship)._metas.renderType.has_value_ = false;
  (this->_relationship)._metas.sdrMetadata.has_value_ = false;
  *(undefined8 *)((long)&(this->_relationship)._metas.renderType.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.renderType.contained + 0x18) = 0;
  *(undefined8 *)&(this->_relationship)._metas.renderType.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.renderType.contained + 8) = 0;
  (this->_relationship)._metas.displayName.has_value_ = false;
  *(undefined8 *)((long)&(this->_relationship)._metas.sdrMetadata.contained + 0x20) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.sdrMetadata.contained + 0x28) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.sdrMetadata.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.sdrMetadata.contained + 0x18) = 0;
  *(undefined8 *)&(this->_relationship)._metas.sdrMetadata.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.sdrMetadata.contained + 8) = 0;
  (this->_relationship)._metas.displayGroup.has_value_ = false;
  *(undefined8 *)((long)&(this->_relationship)._metas.displayName.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.displayName.contained + 0x18) = 0;
  *(undefined8 *)&(this->_relationship)._metas.displayName.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.displayName.contained + 8) = 0;
  (this->_relationship)._metas.bindMaterialAs.has_value_ = false;
  *(undefined8 *)((long)&(this->_relationship)._metas.displayGroup.contained + 0x10) = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.displayGroup.contained + 0x18) = 0;
  *(undefined8 *)&(this->_relationship)._metas.displayGroup.contained = 0;
  *(undefined8 *)((long)&(this->_relationship)._metas.displayGroup.contained + 8) = 0;
  *(undefined8 *)
   ((long)&(this->_relationship).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_finish + 4) = 0;
  *(undefined8 *)
   ((long)&(this->_relationship).targetPathVector.
           super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage + 4) = 0;
  (this->_relationship).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_relationship).targetPathVector.
  super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->_relationship)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 0x10) =
       p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->_relationship)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_header + 0x18) =
       p_Var1;
  (this->_relationship)._varying_authored = false;
  (this->_relationship)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_relationship)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->_relationship)._metas.meta._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->_relationship)._metas.stringData.
  super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  return;
}

Assistant:

RelationshipProperty() = default;